

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

uchar * base64_encode_abi_cxx11_(uchar *bytes_to_encode,uint in_len)

{
  char *pcVar1;
  int iVar2;
  undefined1 *puVar3;
  int in_EDX;
  int iVar4;
  undefined4 in_register_00000034;
  undefined1 local_2b [3];
  undefined1 uStack_28;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  int j;
  int i;
  undefined1 *puStack_18;
  uint in_len_local;
  uchar *bytes_to_encode_local;
  string *ret;
  
  std::__cxx11::string::string((string *)bytes_to_encode);
  stack0xffffffffffffffdc = 0;
  _uStack_28 = 0;
  i = in_EDX;
  puStack_18 = (undefined1 *)CONCAT44(in_register_00000034,in_len);
  while (iVar2 = i + -1, i != 0) {
    puVar3 = puStack_18 + 1;
    iVar4 = stack0xffffffffffffffdc + 1;
    local_2b[stack0xffffffffffffffdc] = *puStack_18;
    unique0x10000103 = iVar4;
    i = iVar2;
    puStack_18 = puVar3;
    if (iVar4 == 3) {
      for (stack0xffffffffffffffdc = 0; stack0xffffffffffffffdc < 4;
          register0x00000000 = stack0xffffffffffffffdc + 1) {
        pcVar1 = (char *)std::__cxx11::string::operator[](0x25d0a8);
        std::__cxx11::string::operator+=((string *)bytes_to_encode,*pcVar1);
      }
      stack0xffffffffffffffdc = 0;
    }
  }
  if (stack0xffffffffffffffdc != 0) {
    for (_uStack_28 = stack0xffffffffffffffdc; _uStack_28 < 3; _uStack_28 = _uStack_28 + 1) {
      local_2b[_uStack_28] = 0;
    }
    for (_uStack_28 = 0; _uStack_28 < stack0xffffffffffffffdc + 1; _uStack_28 = _uStack_28 + 1) {
      pcVar1 = (char *)std::__cxx11::string::operator[](0x25d0a8);
      std::__cxx11::string::operator+=((string *)bytes_to_encode,*pcVar1);
    }
    while (stack0xffffffffffffffdc < 3) {
      unique0x100000fb = stack0xffffffffffffffdc + 1;
      std::__cxx11::string::operator+=((string *)bytes_to_encode,'=');
    }
  }
  return bytes_to_encode;
}

Assistant:

std::string base64_encode(unsigned char const* bytes_to_encode, unsigned int in_len) {
  std::string ret;
  int i = 0;
  int j = 0;
  unsigned char char_array_3[3];
  unsigned char char_array_4[4];

  while (in_len--) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for(i = 0; (i <4) ; i++)
        ret += base64_chars[char_array_4[i]];
      i = 0;
    }
  }

  if (i)
  {
    for(j = i; j < 3; j++)
      char_array_3[j] = '\0';

    char_array_4[0] = ( char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);

    for (j = 0; (j < i + 1); j++)
      ret += base64_chars[char_array_4[j]];

    while((i++ < 3))
      ret += '=';

  }

  return ret;

}